

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O1

menu_iter * menu_find_iter(menu_iter_id id)

{
  menu_iter *pmVar1;
  menu_iter *pmVar2;
  
  pmVar2 = (menu_iter *)0x0;
  if (id == MN_ITER_STRINGS) {
    pmVar2 = &menu_iter_strings;
  }
  pmVar1 = &menu_iter_actions;
  if (id != MN_ITER_ACTIONS) {
    pmVar1 = pmVar2;
  }
  return pmVar1;
}

Assistant:

const menu_iter *menu_find_iter(menu_iter_id id)
{
	switch (id)
	{
		case MN_ITER_ACTIONS:
			return &menu_iter_actions;

		case MN_ITER_STRINGS:
			return &menu_iter_strings;
	}

	return NULL;
}